

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int __thiscall
google::protobuf::io::EpsCopyOutputStream::Flush(EpsCopyOutputStream *this,uint8_t *ptr)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogMessage local_80;
  Voidify local_69;
  int local_68;
  byte local_61;
  int s;
  Voidify local_4d [20];
  byte local_39;
  LogMessage local_38;
  Voidify local_25;
  int local_24;
  uint8_t *puStack_20;
  int overrun;
  uint8_t *ptr_local;
  EpsCopyOutputStream *this_local;
  
  puStack_20 = ptr;
  ptr_local = (uint8_t *)this;
  while( true ) {
    bVar1 = false;
    if (this->buffer_end_ != (uint8_t *)0x0) {
      bVar1 = this->end_ < puStack_20;
    }
    if (!bVar1) {
      if (this->buffer_end_ == (uint8_t *)0x0) {
        local_68 = ((int)this->end_ + 0x10) - (int)puStack_20;
        this->buffer_end_ = puStack_20;
      }
      else {
        memcpy(this->buffer_end_,this->buffer_,(long)puStack_20 - (long)this->buffer_);
        this->buffer_end_ = this->buffer_end_ + ((long)puStack_20 - (long)this->buffer_);
        local_68 = (int)this->end_ - (int)puStack_20;
      }
      if (-1 < local_68) {
        return local_68;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x2f5,"s >= 0");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_80);
    }
    local_24 = (int)puStack_20 - (int)this->end_;
    local_39 = 0;
    if ((this->had_error_ & 1U) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x2e6,"!had_error_");
      local_39 = 1;
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_25,pLVar2);
    }
    if ((local_39 & 1) != 0) break;
    local_61 = 0;
    if (0x10 < local_24) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&s,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x2e7,"overrun <= kSlopBytes");
      local_61 = 1;
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&s);
      absl::lts_20250127::log_internal::Voidify::operator&&(local_4d,pLVar2);
    }
    if ((local_61 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&s);
    }
    puStack_20 = Next(this);
    puStack_20 = puStack_20 + local_24;
    if ((this->had_error_ & 1U) != 0) {
      return 0;
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

int EpsCopyOutputStream::Flush(uint8_t* ptr) {
  while (buffer_end_ && ptr > end_) {
    int overrun = ptr - end_;
    ABSL_DCHECK(!had_error_);
    ABSL_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
    if (had_error_) return 0;
  }
  int s;
  if (buffer_end_) {
    std::memcpy(buffer_end_, buffer_, ptr - buffer_);
    buffer_end_ += ptr - buffer_;
    s = end_ - ptr;
  } else {
    // The stream is writing directly in the ZeroCopyOutputStream buffer.
    s = end_ + kSlopBytes - ptr;
    buffer_end_ = ptr;
  }
  ABSL_DCHECK(s >= 0);  // NOLINT
  return s;
}